

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.hpp
# Opt level: O2

void __thiscall
diy::Master::Master(Master *this,communicator *comm,int threads__,int limit__,CreateBlock *create_,
                   DestroyBlock *destroy_,ExternalStorage *storage,SaveBlock save,LoadBlock load_,
                   QueuePolicy *q_policy)

{
  _Rb_tree_header *p_Var1;
  communicator *this_00;
  _List_node_base *p_Var2;
  InFlightRecvsMap *pIVar3;
  CollectivesMap *pCVar4;
  _Base_ptr p_Var5;
  uint s;
  Collection *local_27c8;
  function<void_(void_*,_diy::BinaryBuffer_&)> local_27c0;
  function<void_(const_void_*,_diy::BinaryBuffer_&)> local_27a0;
  function<void_(void_*)> local_2780;
  function<void_*()> local_2760;
  random_device rd;
  mt19937 gen;
  
  (this->links_).super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->links_).super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->links_).super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::function<void_*()>::function(&local_2760,create_);
  std::function<void_(void_*)>::function(&local_2780,destroy_);
  std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::function
            (&local_27a0,
             (function<void_(const_void_*,_diy::BinaryBuffer_&)> *)
             save.super__Function_base._M_functor._M_unused._0_8_);
  std::function<void_(void_*,_diy::BinaryBuffer_&)>::function
            (&local_27c0,
             (function<void_(void_*,_diy::BinaryBuffer_&)> *)
             save.super__Function_base._M_functor._8_8_);
  local_27c8 = &this->blocks_;
  Collection::Collection(local_27c8,&local_2760,&local_2780,storage,&local_27a0,&local_27c0);
  std::_Function_base::~_Function_base(&local_27c0.super__Function_base);
  std::_Function_base::~_Function_base(&local_27a0.super__Function_base);
  std::_Function_base::~_Function_base(&local_2780.super__Function_base);
  std::_Function_base::~_Function_base(&local_2760.super__Function_base);
  (this->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->lids_)._M_t._M_impl.super__Rb_tree_header;
  (this->lids_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->lids_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->lids_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->lids_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->lids_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->queue_policy_ = (QueuePolicy *)save.super__Function_base._M_manager;
  this->limit_ = limit__;
  if (threads__ == -1) {
    threads__ = std::thread::hardware_concurrency();
  }
  this->threads_ = threads__;
  this->storage_ = storage;
  this_00 = &this->comm_;
  mpi::communicator::communicator(this_00);
  p_Var1 = &(this->incoming_)._M_t._M_impl.super__Rb_tree_header;
  (this->incoming_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->incoming_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->incoming_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->incoming_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->incoming_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->outgoing_)._M_t._M_impl.super__Rb_tree_header;
  (this->outgoing_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->outgoing_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->outgoing_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->outgoing_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->outgoing_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = (_List_node_base *)operator_new(0x18);
  *(_List_node_base **)
   &((list<diy::Master::InFlightSend,_std::allocator<diy::Master::InFlightSend>_> *)&p_Var2->_M_prev
    )->super__List_base<diy::Master::InFlightSend,_std::allocator<diy::Master::InFlightSend>_> =
       p_Var2;
  p_Var2->_M_next = p_Var2;
  p_Var2[1]._M_next = 0;
  (this->inflight_sends_)._M_t.
  super___uniq_ptr_impl<diy::Master::InFlightSendsList,_std::default_delete<diy::Master::InFlightSendsList>_>
  ._M_t.
  super__Tuple_impl<0UL,_diy::Master::InFlightSendsList_*,_std::default_delete<diy::Master::InFlightSendsList>_>
  .super__Head_base<0UL,_diy::Master::InFlightSendsList_*,_false>._M_head_impl =
       (InFlightSendsList *)p_Var2;
  pIVar3 = (InFlightRecvsMap *)operator_new(0x30);
  (((_Rb_tree_header *)
   ((long)&(pIVar3->
           super_map<int,_diy::Master::InFlightRecv,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::InFlightRecv>_>_>
           )._M_t + 8))->_M_header)._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(pIVar3->
           super_map<int,_diy::Master::InFlightRecv,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::InFlightRecv>_>_>
           )._M_t + 0x10) = (_Base_ptr)0x0;
  p_Var5 = (_Base_ptr)
           ((long)&(pIVar3->
                   super_map<int,_diy::Master::InFlightRecv,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::InFlightRecv>_>_>
                   )._M_t + 8);
  *(_Base_ptr *)
   ((long)&(pIVar3->
           super_map<int,_diy::Master::InFlightRecv,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::InFlightRecv>_>_>
           )._M_t + 0x18) = p_Var5;
  *(_Base_ptr *)
   ((long)&(pIVar3->
           super_map<int,_diy::Master::InFlightRecv,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::InFlightRecv>_>_>
           )._M_t + 0x20) = p_Var5;
  *(size_t *)
   ((long)&(pIVar3->
           super_map<int,_diy::Master::InFlightRecv,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::InFlightRecv>_>_>
           )._M_t + 0x28) = 0;
  (this->inflight_recvs_)._M_t.
  super___uniq_ptr_impl<diy::Master::InFlightRecvsMap,_std::default_delete<diy::Master::InFlightRecvsMap>_>
  ._M_t.
  super__Tuple_impl<0UL,_diy::Master::InFlightRecvsMap_*,_std::default_delete<diy::Master::InFlightRecvsMap>_>
  .super__Head_base<0UL,_diy::Master::InFlightRecvsMap_*,_false>._M_head_impl = pIVar3;
  pCVar4 = (CollectivesMap *)operator_new(0x30);
  p_Var5 = (_Base_ptr)
           ((long)&(pCVar4->
                   super_map<int,_diy::Master::CollectivesList,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::CollectivesList>_>_>
                   )._M_t + 8);
  (((_Rb_tree_header *)
   ((long)&(pCVar4->
           super_map<int,_diy::Master::CollectivesList,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::CollectivesList>_>_>
           )._M_t + 8))->_M_header)._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(pCVar4->
           super_map<int,_diy::Master::CollectivesList,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::CollectivesList>_>_>
           )._M_t + 0x10) = (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)&(pCVar4->
           super_map<int,_diy::Master::CollectivesList,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::CollectivesList>_>_>
           )._M_t + 0x18) = p_Var5;
  *(_Base_ptr *)
   ((long)&(pCVar4->
           super_map<int,_diy::Master::CollectivesList,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::CollectivesList>_>_>
           )._M_t + 0x20) = p_Var5;
  *(size_t *)
   ((long)&(pCVar4->
           super_map<int,_diy::Master::CollectivesList,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::CollectivesList>_>_>
           )._M_t + 0x28) = 0;
  (this->collectives_)._M_t.
  super___uniq_ptr_impl<diy::Master::CollectivesMap,_std::default_delete<diy::Master::CollectivesMap>_>
  ._M_t.
  super__Tuple_impl<0UL,_diy::Master::CollectivesMap_*,_std::default_delete<diy::Master::CollectivesMap>_>
  .super__Head_base<0UL,_diy::Master::CollectivesMap_*,_false>._M_head_impl = pCVar4;
  this->expected_ = 0;
  this->exchange_round_ = -1;
  this->immediate_ = true;
  (this->commands_).
  super__Vector_base<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->commands_).
  super__Vector_base<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->commands_).
           super__Vector_base<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->commands_).
           super__Vector_base<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  std::make_shared<diy::spd::logger>();
  stats::DurationAccumulator::DurationAccumulator(&(this->prof).total);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&this->mt_gen);
  mpi::communicator::duplicate(this_00,comm);
  std::random_device::random_device(&rd);
  s = std::random_device::_M_getval();
  mpi::Collectives<unsigned_int,_void_*>::broadcast(this_00,&s,0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&gen,(ulong)((this->comm_).rank_ + s));
  memcpy(&this->mt_gen,&gen,5000);
  std::random_device::~random_device(&rd);
  return;
}

Assistant:

diy::Master::
Master(mpi::communicator    comm,
       int                  threads__,
       int                  limit__,
       CreateBlock          create_,
       DestroyBlock         destroy_,
       ExternalStorage*     storage,
       SaveBlock            save,
       LoadBlock            load_,
       QueuePolicy*         q_policy):
  blocks_(create_, destroy_, storage, save, load_),
  queue_policy_(q_policy),
  limit_(limit__),
#if !defined(DIY_NO_THREADS)
  threads_(threads__ == -1 ? static_cast<int>(thread::hardware_concurrency()) : threads__),
#else
  threads_(1),
#endif
  storage_(storage),
  // Communicator functionality
  inflight_sends_(new InFlightSendsList),
  inflight_recvs_(new InFlightRecvsMap),
  collectives_(new CollectivesMap)
{
#ifdef DIY_NO_THREADS
  (void) threads__;
#endif
    comm_.duplicate(comm);

    // seed random number generator, broadcast seed, offset by rank
    std::random_device rd;                      // seed source for the random number engine
    unsigned int s = rd();
    diy::mpi::broadcast(communicator(), s, 0);
    std::mt19937 gen(s + communicator().rank());          // mersenne_twister random number generator
    mt_gen = gen;
}